

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O3

Polynom<Rational> __thiscall
Polynom<Rational>::operator*(Polynom<Rational> *this,Polynom<Rational> *a)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long in_RDX;
  Rational *extraout_RDX;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Polynom<Rational> PVar7;
  Rational local_70;
  
  Polynom(this,((a->m).N + *(int *)(in_RDX + 4)) - 1);
  uVar5 = (a->m).N;
  if (uVar5 != 0) {
    uVar2 = *(uint *)(in_RDX + 4);
    iVar3 = 0;
    uVar4 = 0;
    do {
      uVar1 = 0;
      if (uVar2 != 0) {
        uVar5 = 0;
        iVar6 = -1;
        do {
          ::operator*(&local_70,(a->m).arr + ((a->m).N + ~uVar4),
                      (Rational *)((ulong)(uVar2 + iVar6) * 0x40 + *(long *)(in_RDX + 8)));
          Rational::operator+=((this->m).arr + (iVar3 + iVar6 + (this->m).N),&local_70);
          if (local_70._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70._denominator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_70._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar5 = uVar5 + 1;
          uVar2 = *(uint *)(in_RDX + 4);
          iVar6 = iVar6 + -1;
        } while (uVar5 < uVar2);
        uVar5 = (a->m).N;
        uVar1 = uVar2;
      }
      uVar2 = uVar1;
      uVar4 = uVar4 + 1;
      iVar3 = iVar3 + -1;
    } while (uVar4 < uVar5);
  }
  strip(this);
  PVar7.m.arr = extraout_RDX;
  PVar7.m._0_8_ = this;
  return (Polynom<Rational>)PVar7.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::operator*(const Polynom &a) const
{
    Polynom temp(m.width() + a.m.width() - 1);
    for(unsigned i = 0; i < m.width(); ++i)
    {
        for(unsigned j = 0; j < a.m.width(); ++j)
        {
            temp.m[0][temp.m.width() - 1 - i - j] += m[0][m.width() - 1 - i] * a.m[0][a.m.width() - 1 - j];
        }
    }
    temp.strip();
    return temp;
}